

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  TValue *local_30;
  StkId o;
  size_t *len_local;
  int idx_local;
  lua_State *L_local;
  
  local_30 = index2adr(L,idx);
  if (local_30->tt != 4) {
    iVar1 = luaV_tostring(L,local_30);
    if (iVar1 == 0) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
    local_30 = index2adr(L,idx);
  }
  if (len != (size_t *)0x0) {
    *len = (size_t)(((local_30->value).gc)->h).metatable;
  }
  return (char *)&(((local_30->value).gc)->h).array;
}

Assistant:

static const char*lua_tolstring(lua_State*L,int idx,size_t*len){
StkId o=index2adr(L,idx);
if(!ttisstring(o)){
if(!luaV_tostring(L,o)){
if(len!=NULL)*len=0;
return NULL;
}
luaC_checkGC(L);
o=index2adr(L,idx);
}
if(len!=NULL)*len=tsvalue(o)->len;
return svalue(o);
}